

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

void h265e_code_slice_header(H265eSlice *slice,MppWriteCtx *bitIf,RK_U32 slice_segment_addr)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  uint uVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  H265eSps *pHVar9;
  H265eReferencePictureSet *rps_00;
  RK_U8 RVar10;
  RK_S32 RVar11;
  bool bVar12;
  RK_U32 local_dc;
  RK_S32 code;
  RK_S32 flag;
  RK_S32 length;
  RK_S32 numRpsCurrTempList0;
  H265eRefPicListModification *refPicListModification;
  RK_U32 overrideFlag;
  RK_S32 differenceInDeltaMSB;
  RK_U32 deltaFlag;
  RK_S32 offset;
  RK_S32 prevDeltaMSB;
  RK_S32 bitsForLtrpInSPS;
  RK_S32 k;
  RK_S32 counter;
  RK_U32 ltrpIndex;
  RK_S32 numLtrpInSPS;
  RK_S32 ltrpInSPS [16];
  int local_50;
  RK_S32 numLtrpInSH;
  RK_S32 numBits;
  RK_S32 picOrderCntLSB;
  H265eReferencePictureSet *rps;
  RK_U32 max_ctu_num;
  RK_U32 pic_height_in_ctb;
  RK_U32 pic_width_in_ctb;
  H265eSps *sps;
  uint local_20;
  RK_U32 slice_address_addr_bits;
  RK_U32 i;
  RK_U32 slice_segment_addr_local;
  MppWriteCtx *bitIf_local;
  H265eSlice *slice_local;
  
  sps._4_4_ = 0;
  pHVar9 = slice->m_sps;
  RVar1 = pHVar9->m_picWidthInLumaSamples;
  RVar2 = pHVar9->m_maxCUSize;
  uVar3 = pHVar9->m_maxCUSize;
  RVar4 = pHVar9->m_picHeightInLumaSamples;
  RVar5 = pHVar9->m_maxCUSize;
  uVar6 = pHVar9->m_maxCUSize;
  mpp_writer_put_bits(bitIf,(uint)(slice_segment_addr == 0),1);
  mpp_writer_put_ue(bitIf,slice->m_ppsId);
  if (slice_segment_addr != 0) {
    for (; (uint)(1 << ((byte)sps._4_4_ & 0x1f)) <
           (((RVar1 + RVar2) - 1) / uVar3) * (((RVar4 + RVar5) - 1) / uVar6);
        sps._4_4_ = sps._4_4_ + 1) {
    }
    mpp_writer_put_bits(bitIf,slice_segment_addr,sps._4_4_);
  }
  rps_00 = slice->m_rps;
  slice->m_enableTMVPFlag = 0;
  if (slice->m_dependentSliceSegmentFlag == 0) {
    for (local_20 = 0; local_20 < (uint)slice->m_pps->m_numExtraSliceHeaderBits;
        local_20 = local_20 + 1) {
      mpp_writer_put_bits(bitIf,slice->slice_reserved_flag >> ((byte)local_20 & 0x1f) & 1,1);
    }
    mpp_writer_put_ue(bitIf,slice->m_sliceType);
    if (slice->m_pps->m_outputFlagPresentFlag != 0) {
      mpp_writer_put_bits(bitIf,(uint)(slice->m_picOutputFlag != 0),1);
    }
    if (slice->m_sliceType != I_SLICE) {
      mpp_writer_put_bits(bitIf,((slice->poc - slice->last_idr) +
                                (1 << ((byte)slice->m_sps->m_bitsForPOC & 0x1f))) %
                                (1 << ((byte)slice->m_sps->m_bitsForPOC & 0x1f)),
                          slice->m_sps->m_bitsForPOC);
      if (slice->m_bdIdx < 0) {
        mpp_writer_put_bits(bitIf,0,1);
        code_st_refpic_set(bitIf,rps_00,(slice->m_sps->m_RPSList).m_numberOfReferencePictureSets);
      }
      else {
        mpp_writer_put_bits(bitIf,1,1);
        for (local_50 = 0;
            1 << ((byte)local_50 & 0x1f) < (slice->m_sps->m_RPSList).m_numberOfReferencePictureSets;
            local_50 = local_50 + 1) {
        }
        if (0 < local_50) {
          mpp_writer_put_bits(bitIf,slice->m_bdIdx,local_50);
        }
      }
      if (slice->m_sps->m_bLongTermRefsPresent != 0) {
        ltrpInSPS[0xf] = rps_00->m_numberOfPictures;
        counter = 0;
        bitsForLtrpInSPS = 0;
        prevDeltaMSB = rps_00->m_numberOfPictures;
        while (prevDeltaMSB = prevDeltaMSB + -1,
              (rps_00->m_numberOfPictures - rps_00->num_long_term_pic) + -1 < prevDeltaMSB) {
          RVar10 = find_matching_ltrp(slice,(RK_U32 *)&k,rps_00->poc[prevDeltaMSB],
                                      rps_00->m_used[prevDeltaMSB]);
          if (RVar10 == '\0') {
            bitsForLtrpInSPS = bitsForLtrpInSPS + 1;
          }
          else {
            (&ltrpIndex)[counter] = k;
            counter = counter + 1;
          }
        }
        ltrpInSPS[0xf] = ltrpInSPS[0xf] - (rps_00->m_numberOfPictures - rps_00->num_long_term_pic);
        for (offset = 0; (uint)(1 << ((byte)offset & 0x1f)) < slice->m_sps->m_numLongTermRefPicSPS;
            offset = offset + 1) {
        }
        if (slice->m_sps->m_numLongTermRefPicSPS != 0) {
          mpp_writer_put_ue(bitIf,counter);
        }
        mpp_writer_put_ue(bitIf,ltrpInSPS[0xf]);
        deltaFlag = 0;
        iVar7 = rps_00->num_negative_pic;
        iVar8 = rps_00->num_positive_pic;
        prevDeltaMSB = rps_00->m_numberOfPictures;
        while (prevDeltaMSB = prevDeltaMSB + -1, iVar7 + iVar8 + -1 < prevDeltaMSB) {
          if (bitsForLtrpInSPS < counter) {
            if (0 < offset) {
              mpp_writer_put_bits(bitIf,(&ltrpIndex)[bitsForLtrpInSPS],offset);
            }
          }
          else {
            mpp_writer_put_bits(bitIf,rps_00->m_pocLSBLT[prevDeltaMSB],slice->m_sps->m_bitsForPOC);
            mpp_writer_put_bits(bitIf,rps_00->m_used[prevDeltaMSB],1);
          }
          mpp_writer_put_bits(bitIf,rps_00->m_deltaPocMSBPresentFlag[prevDeltaMSB],1);
          if (rps_00->m_deltaPocMSBPresentFlag[prevDeltaMSB] != 0) {
            bVar12 = false;
            if ((prevDeltaMSB == rps_00->m_numberOfPictures + -1) ||
               (prevDeltaMSB == (rps_00->m_numberOfPictures + -1) - counter)) {
              bVar12 = true;
            }
            if (bVar12) {
              mpp_writer_put_ue(bitIf,rps_00->m_deltaPOCMSBCycleLT[prevDeltaMSB]);
            }
            else {
              mpp_writer_put_ue(bitIf,rps_00->m_deltaPOCMSBCycleLT[prevDeltaMSB] - deltaFlag);
            }
            deltaFlag = rps_00->m_deltaPOCMSBCycleLT[prevDeltaMSB];
          }
        }
      }
      if (slice->m_sps->m_TMVPFlagsPresent != 0) {
        mpp_writer_put_bits(bitIf,(uint)(slice->m_enableTMVPFlag != 0),1);
      }
    }
    if (slice->m_sps->m_bUseSAO != 0) {
      mpp_writer_put_bits(bitIf,0,1);
      mpp_writer_put_bits(bitIf,0,1);
    }
    if ((slice->m_sliceType != I_SLICE) &&
       (bVar12 = slice->m_numRefIdx[0] != slice->m_pps->m_numRefIdxL0DefaultActive,
       mpp_writer_put_bits(bitIf,(uint)bVar12,1), bVar12)) {
      mpp_writer_put_ue(bitIf,slice->m_numRefIdx[0] - 1);
      slice->m_numRefIdx[1] = 0;
    }
    if ((((slice->m_pps->m_listsModificationPresentFlag != 0) &&
         (RVar11 = get_num_rps_cur_templist(rps_00), 1 < RVar11)) &&
        (mpp_writer_put_bits(bitIf,(uint)((slice->m_RefPicListModification).
                                          m_refPicListModificationFlagL0 != 0),1),
        (slice->m_RefPicListModification).m_refPicListModificationFlagL0 != 0)) &&
       (RVar11 = get_num_rps_cur_templist(rps_00), 1 < RVar11)) {
      code = 1;
      flag = RVar11 + -1;
      while (flag = flag >> 1, flag != 0) {
        code = code + 1;
      }
      for (local_20 = 0; local_20 < (uint)slice->m_numRefIdx[0]; local_20 = local_20 + 1) {
        mpp_writer_put_bits(bitIf,(slice->m_RefPicListModification).m_RefPicSetIdxL0[local_20],code)
        ;
      }
    }
    if (slice->m_pps->m_cabacInitPresentFlag != 0) {
      mpp_writer_put_bits(bitIf,slice->m_cabacInitFlag,1);
    }
    if (((slice->m_enableTMVPFlag != 0) && (slice->m_sliceType != I_SLICE)) &&
       (((slice->m_colFromL0Flag == 1 && (1 < slice->m_numRefIdx[0])) ||
        ((slice->m_colFromL0Flag == 0 && (1 < slice->m_numRefIdx[1])))))) {
      mpp_writer_put_ue(bitIf,slice->m_colRefIdx);
    }
    if (slice->m_sliceType != I_SLICE) {
      local_dc = 5 - slice->m_maxNumMergeCand;
      if (local_dc == 5) {
        local_dc = 4;
      }
      mpp_writer_put_ue(bitIf,local_dc);
    }
    mpp_writer_put_se(bitIf,slice->m_sliceQp - (slice->m_pps->m_picInitQPMinus26 + 0x1a));
    if (slice->m_pps->m_bSliceChromaQpFlag != 0) {
      mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCb);
      mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCr);
    }
    if (slice->m_pps->m_deblockingFilterControlPresentFlag != 0) {
      if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag != 0) {
        mpp_writer_put_bits(bitIf,slice->m_deblockingFilterOverrideFlag,1);
      }
      if ((slice->m_deblockingFilterOverrideFlag != 0) &&
         (mpp_writer_put_bits(bitIf,slice->m_deblockingFilterDisable,1),
         slice->m_deblockingFilterDisable == 0)) {
        mpp_writer_put_se(bitIf,slice->m_deblockingFilterBetaOffsetDiv2);
        mpp_writer_put_se(bitIf,slice->m_deblockingFilterTcOffsetDiv2);
      }
    }
  }
  if (slice->m_pps->m_tiles_enabled_flag != 0) {
    mpp_writer_put_ue(bitIf,0);
  }
  if (slice->m_pps->m_sliceHeaderExtensionPresentFlag != 0) {
    mpp_writer_put_ue(bitIf,slice->slice_header_extension_length);
    for (local_20 = 0; local_20 < slice->slice_header_extension_length; local_20 = local_20 + 1) {
      mpp_writer_put_bits(bitIf,0,8);
    }
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_header");
  }
  return;
}

Assistant:

void h265e_code_slice_header(H265eSlice *slice, MppWriteCtx *bitIf,
                             RK_U32 slice_segment_addr)
{
    RK_U32 i = 0;
    RK_U32 slice_address_addr_bits = 0;
    H265eSps *sps = slice->m_sps;
    RK_U32 pic_width_in_ctb = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) /
                              sps->m_maxCUSize;
    RK_U32 pic_height_in_ctb = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) /
                               sps->m_maxCUSize;
    RK_U32 max_ctu_num = pic_width_in_ctb * pic_height_in_ctb;

    mpp_writer_put_bits(bitIf, (slice_segment_addr == 0), 1); //first_slice_segment_in_pic_flag
    mpp_writer_put_ue(bitIf, slice->m_ppsId);

    if (slice_segment_addr != 0) {
        while (max_ctu_num > (RK_U32)(1 << slice_address_addr_bits)) {
            slice_address_addr_bits++;
        }
        //slice_segment_address
        mpp_writer_put_bits(bitIf, slice_segment_addr, slice_address_addr_bits);
    }

    H265eReferencePictureSet* rps = slice->m_rps;
    slice->m_enableTMVPFlag = 0;
    if (!slice->m_dependentSliceSegmentFlag) {
        for (i = 0; i < (RK_U32)slice->m_pps->m_numExtraSliceHeaderBits; i++) {
            mpp_writer_put_bits(bitIf, (slice->slice_reserved_flag >> i) & 0x1, 1);
        }

        mpp_writer_put_ue(bitIf, slice->m_sliceType);

        if (slice->m_pps->m_outputFlagPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_picOutputFlag ? 1 : 0, 1);
        }

        if (slice->m_sliceType != I_SLICE) { // skip frame can't iDR
            RK_S32 picOrderCntLSB = (slice->poc - slice->last_idr + (1 << slice->m_sps->m_bitsForPOC)) % (1 << slice->m_sps->m_bitsForPOC);
            mpp_writer_put_bits(bitIf, picOrderCntLSB, slice->m_sps->m_bitsForPOC);
            if (slice->m_bdIdx < 0) {
                mpp_writer_put_bits(bitIf, 0, 1);
                code_st_refpic_set(bitIf, rps, slice->m_sps->m_RPSList.m_numberOfReferencePictureSets);
            } else {
                mpp_writer_put_bits(bitIf, 1, 1);
                RK_S32 numBits = 0;
                while ((1 << numBits) < slice->m_sps->m_RPSList.m_numberOfReferencePictureSets) {
                    numBits++;
                }

                if (numBits > 0) {
                    mpp_writer_put_bits(bitIf, slice->m_bdIdx, numBits);
                }
            }
            if (slice->m_sps->m_bLongTermRefsPresent) {

                RK_S32 numLtrpInSH = rps->m_numberOfPictures;
                RK_S32 ltrpInSPS[MAX_REFS];
                RK_S32 numLtrpInSPS = 0;
                RK_U32 ltrpIndex;
                RK_S32 counter = 0;
                RK_S32 k;
                for (k = rps->m_numberOfPictures - 1; k > rps->m_numberOfPictures - rps->num_long_term_pic - 1; k--) {
                    if (find_matching_ltrp(slice, &ltrpIndex, rps->poc[k], rps->m_used[k])) {
                        ltrpInSPS[numLtrpInSPS] = ltrpIndex;
                        numLtrpInSPS++;
                    } else {
                        counter++;
                    }
                }

                numLtrpInSH -= rps->m_numberOfPictures - rps->num_long_term_pic;

                RK_S32 bitsForLtrpInSPS = 0;
                while (slice->m_sps->m_numLongTermRefPicSPS > (RK_U32)(1 << bitsForLtrpInSPS)) {
                    bitsForLtrpInSPS++;
                }

                if (slice->m_sps->m_numLongTermRefPicSPS > 0) {
                    mpp_writer_put_ue(bitIf, numLtrpInSPS);
                }
                mpp_writer_put_ue(bitIf, numLtrpInSH);
                // Note that the LSBs of the LT ref. pic. POCs must be sorted before.
                // Not sorted here because LT ref indices will be used in setRefPicList()
                RK_S32 prevDeltaMSB = 0;
                RK_S32 offset = rps->num_negative_pic + rps->num_positive_pic;
                for ( k = rps->m_numberOfPictures - 1; k > offset - 1; k--) {
                    if (counter < numLtrpInSPS) {
                        if (bitsForLtrpInSPS > 0) {
                            mpp_writer_put_bits(bitIf, ltrpInSPS[counter], bitsForLtrpInSPS);
                        }
                    } else {
                        mpp_writer_put_bits(bitIf, rps->m_pocLSBLT[k], slice->m_sps->m_bitsForPOC);
                        mpp_writer_put_bits(bitIf, rps->m_used[k], 1);
                    }
                    mpp_writer_put_bits(bitIf, rps->m_deltaPocMSBPresentFlag[k], 1);

                    if (rps->m_deltaPocMSBPresentFlag[k]) {
                        RK_U32 deltaFlag = 0;
                        if ((k == rps->m_numberOfPictures - 1) || (k == rps->m_numberOfPictures - 1 - numLtrpInSPS)) {
                            deltaFlag = 1;
                        }
                        if (deltaFlag) {
                            mpp_writer_put_ue(bitIf, rps->m_deltaPOCMSBCycleLT[k]);
                        } else {
                            RK_S32 differenceInDeltaMSB = rps->m_deltaPOCMSBCycleLT[k] - prevDeltaMSB;
                            mpp_writer_put_ue(bitIf, differenceInDeltaMSB);
                        }
                        prevDeltaMSB = rps->m_deltaPOCMSBCycleLT[k];
                    }
                }
            }
            if (slice->m_sps->m_TMVPFlagsPresent) {
                mpp_writer_put_bits(bitIf, slice->m_enableTMVPFlag ? 1 : 0, 1);
            }
        }

        if (slice->m_sps->m_bUseSAO) { //skip frame close sao
            mpp_writer_put_bits(bitIf, 0, 1);
            mpp_writer_put_bits(bitIf, 0, 1);

        }
        //check if numrefidxes match the defaults. If not, override

        if (slice->m_sliceType != I_SLICE) {
            RK_U32 overrideFlag = (slice->m_numRefIdx[0] != (RK_S32)slice->m_pps->m_numRefIdxL0DefaultActive);
            mpp_writer_put_bits(bitIf, overrideFlag ? 1 : 0, 1);
            if (overrideFlag) {
                mpp_writer_put_ue(bitIf, slice->m_numRefIdx[0] - 1);
                slice->m_numRefIdx[1] = 0;
            }
        }

        if (slice->m_pps->m_listsModificationPresentFlag && get_num_rps_cur_templist(rps) > 1) {
            H265eRefPicListModification* refPicListModification = &slice->m_RefPicListModification;
            mpp_writer_put_bits(bitIf, refPicListModification->m_refPicListModificationFlagL0 ? 1 : 0, 1);
            if (refPicListModification->m_refPicListModificationFlagL0) {
                RK_S32 numRpsCurrTempList0 = get_num_rps_cur_templist(rps);
                if (numRpsCurrTempList0 > 1) {
                    RK_S32 length = 1;
                    numRpsCurrTempList0--;
                    while (numRpsCurrTempList0 >>= 1) {
                        length++;
                    }
                    for (i = 0; i < (RK_U32)slice->m_numRefIdx[0]; i++) {
                        mpp_writer_put_bits(bitIf, refPicListModification->m_RefPicSetIdxL0[i], length);
                    }
                }
            }
        }

        if (slice->m_pps->m_cabacInitPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_cabacInitFlag, 1);
        }

        if (slice->m_enableTMVPFlag) {

            if (slice->m_sliceType != I_SLICE &&
                ((slice->m_colFromL0Flag == 1 && slice->m_numRefIdx[0] > 1) ||
                 (slice->m_colFromL0Flag == 0 && slice->m_numRefIdx[1] > 1))) {
                mpp_writer_put_ue(bitIf, slice->m_colRefIdx);
            }
        }

        if (slice->m_sliceType != I_SLICE) {
            RK_S32 flag = MRG_MAX_NUM_CANDS - slice->m_maxNumMergeCand;
            flag = flag == 5 ? 4 : flag;
            mpp_writer_put_ue(bitIf, flag);
        }
        RK_S32 code = slice->m_sliceQp - (slice->m_pps->m_picInitQPMinus26 + 26);
        mpp_writer_put_se(bitIf, code);
        if (slice->m_pps->m_bSliceChromaQpFlag) {
            code = slice->m_sliceQpDeltaCb;
            mpp_writer_put_se(bitIf, code);
            code = slice->m_sliceQpDeltaCr;
            mpp_writer_put_se(bitIf, code);
        }
        if (slice->m_pps->m_deblockingFilterControlPresentFlag) {
            if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterOverrideFlag, 1);
            }
            if (slice->m_deblockingFilterOverrideFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterDisable, 1);
                if (!slice->m_deblockingFilterDisable) {
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterBetaOffsetDiv2);
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterTcOffsetDiv2);
                }
            }
        }
    }
    if (slice->m_pps->m_tiles_enabled_flag) {
        mpp_writer_put_ue(bitIf, 0);    // num_entry_point_offsets
    }
    if (slice->m_pps->m_sliceHeaderExtensionPresentFlag) {
        mpp_writer_put_ue(bitIf, slice->slice_header_extension_length);
        for (i = 0; i < slice->slice_header_extension_length; i++) {
            mpp_writer_put_bits(bitIf, 0, 8);
        }
    }
    h265e_dbg_func("leave\n");
}